

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

void __thiscall
cfd::js::api::json::SelectUtxoData::ConvertFromStruct
          (SelectUtxoData *this,SelectUtxoDataStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->txid_);
  this->vout_ = data->vout;
  std::__cxx11::string::_M_assign((string *)&this->asset_);
  std::__cxx11::string::_M_assign((string *)&this->redeem_script_);
  std::__cxx11::string::_M_assign((string *)&this->descriptor_);
  this->is_issuance_ = data->is_issuance;
  this->is_blind_issuance_ = data->is_blind_issuance;
  this->is_pegin_ = data->is_pegin;
  this->pegin_btc_tx_size_ = data->pegin_btc_tx_size;
  this->pegin_tx_out_proof_size_ = data->pegin_tx_out_proof_size;
  std::__cxx11::string::_M_assign((string *)&this->claim_script_);
  std::__cxx11::string::_M_assign((string *)&this->fedpeg_script_);
  std::__cxx11::string::_M_assign((string *)&this->script_sig_template_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void SelectUtxoData::ConvertFromStruct(
    const SelectUtxoDataStruct& data) {
  txid_ = data.txid;
  vout_ = data.vout;
  asset_ = data.asset;
  redeem_script_ = data.redeem_script;
  descriptor_ = data.descriptor;
  is_issuance_ = data.is_issuance;
  is_blind_issuance_ = data.is_blind_issuance;
  is_pegin_ = data.is_pegin;
  pegin_btc_tx_size_ = data.pegin_btc_tx_size;
  pegin_tx_out_proof_size_ = data.pegin_tx_out_proof_size;
  claim_script_ = data.claim_script;
  fedpeg_script_ = data.fedpeg_script;
  script_sig_template_ = data.script_sig_template;
  ignore_items = data.ignore_items;
}